

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void terminate(void)

{
  _GLFWmonitor *monitor;
  _GLFWerror *p_Var1;
  long lVar2;
  
  _glfw.callbacks.monitor = (GLFWmonitorfun)0x0;
  _glfw.callbacks.joystick = (GLFWjoystickfun)0x0;
  while (_glfw.windowListHead != (_GLFWwindow *)0x0) {
    glfwDestroyWindow((GLFWwindow *)_glfw.windowListHead);
  }
  while (_glfw.cursorListHead != (_GLFWcursor *)0x0) {
    glfwDestroyCursor((GLFWcursor *)_glfw.cursorListHead);
  }
  if (0 < _glfw.monitorCount) {
    lVar2 = 0;
    do {
      monitor = _glfw.monitors[lVar2];
      if ((monitor->originalRamp).size != 0) {
        (*_glfw.platform.setGammaRamp)(monitor,&monitor->originalRamp);
      }
      _glfwFreeMonitor(monitor);
      lVar2 = lVar2 + 1;
    } while (lVar2 < _glfw.monitorCount);
  }
  if (_glfw.monitors != (_GLFWmonitor **)0x0) {
    (*_glfw.allocator.deallocate)(_glfw.monitors,_glfw.allocator.user);
  }
  _glfw.monitors = (_GLFWmonitor **)0x0;
  _glfw.monitorCount = 0;
  if (_glfw.mappings != (_GLFWmapping *)0x0) {
    (*_glfw.allocator.deallocate)(_glfw.mappings,_glfw.allocator.user);
  }
  _glfw.mappings = (_GLFWmapping *)0x0;
  _glfw.mappingCount = 0;
  _glfwTerminateVulkan();
  (*_glfw.platform.terminateJoysticks)();
  (*_glfw.platform.terminate)();
  _glfw.initialized = 0;
  while (p_Var1 = _glfw.errorListHead, _glfw.errorListHead != (_GLFWerror *)0x0) {
    _glfw.errorListHead = (_glfw.errorListHead)->next;
    (*_glfw.allocator.deallocate)(p_Var1,_glfw.allocator.user);
  }
  _glfwPlatformDestroyTls(&_glfw.contextSlot);
  _glfwPlatformDestroyTls(&_glfw.errorSlot);
  _glfwPlatformDestroyMutex(&_glfw.errorLock);
  memset(&_glfw,0,0x21e60);
  return;
}

Assistant:

static void terminate(void)
{
    int i;

    memset(&_glfw.callbacks, 0, sizeof(_glfw.callbacks));

    while (_glfw.windowListHead)
        glfwDestroyWindow((GLFWwindow*) _glfw.windowListHead);

    while (_glfw.cursorListHead)
        glfwDestroyCursor((GLFWcursor*) _glfw.cursorListHead);

    for (i = 0;  i < _glfw.monitorCount;  i++)
    {
        _GLFWmonitor* monitor = _glfw.monitors[i];
        if (monitor->originalRamp.size)
            _glfw.platform.setGammaRamp(monitor, &monitor->originalRamp);
        _glfwFreeMonitor(monitor);
    }

    _glfw_free(_glfw.monitors);
    _glfw.monitors = NULL;
    _glfw.monitorCount = 0;

    _glfw_free(_glfw.mappings);
    _glfw.mappings = NULL;
    _glfw.mappingCount = 0;

    _glfwTerminateVulkan();
    _glfw.platform.terminateJoysticks();
    _glfw.platform.terminate();

    _glfw.initialized = GLFW_FALSE;

    while (_glfw.errorListHead)
    {
        _GLFWerror* error = _glfw.errorListHead;
        _glfw.errorListHead = error->next;
        _glfw_free(error);
    }

    _glfwPlatformDestroyTls(&_glfw.contextSlot);
    _glfwPlatformDestroyTls(&_glfw.errorSlot);
    _glfwPlatformDestroyMutex(&_glfw.errorLock);

    memset(&_glfw, 0, sizeof(_glfw));
}